

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integer.cpp
# Opt level: O2

void __thiscall Integer::display(Integer *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"cited: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"type : Integer");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"value: ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void Integer::display() {
    std::cout << "cited: " << cited << std::endl;
    std::cout << "type : Integer" << std::endl;
    std::cout << "value: " << value << std::endl;
    std::cout << std::endl;
}